

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

int __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::erase
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          int *key)

{
  int *piVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  self_type *unaff_R15;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  undefined8 in_XMM0_Qa;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pAVar5 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
           this->root_node_;
  this_00 = pAVar5;
  if ((pAVar5->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar4 = *key;
    auVar12._8_8_ = 0x7fffffffffffffff;
    auVar12._0_8_ = 0x7fffffffffffffff;
    lVar6 = (this->stats_).num_node_lookups;
    auVar11._0_8_ = (double)iVar4;
    auVar11._8_8_ = in_XMM0_Qa;
    do {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (pAVar5->super_AlexNode<int,_int>).model_.a_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (pAVar5->super_AlexNode<int,_int>).model_.b_;
      auVar2 = vfmadd213sd_fma(auVar14,auVar11,auVar2);
      uVar8 = *(int *)&pAVar5->allocator_ - 1;
      dVar13 = auVar2._0_8_;
      uVar7 = ~((int)dVar13 >> 0x1f) & (int)dVar13;
      if ((int)uVar7 <= (int)uVar8) {
        uVar8 = uVar7;
      }
      pAVar5 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                *)(&(pAVar5->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar8];
      bVar3 = (pAVar5->super_AlexNode<int,_int>).is_leaf_;
      if (bVar3 == true) {
        lVar6 = lVar6 + (pAVar5->super_AlexNode<int,_int>).level_;
        auVar14 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar13 + 0.5)));
        (this->stats_).num_node_lookups = lVar6;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar13 - auVar14._0_8_;
        auVar2 = vandpd_avx(auVar15,auVar12);
        this_00 = pAVar5;
        if (dVar13 * 2.220446049250313e-15 < auVar2._0_8_) break;
        if (auVar14._0_8_ <= dVar13) {
          unaff_R15 = pAVar5->prev_leaf_;
          if (unaff_R15 == (self_type *)0x0) break;
          uVar10 = (ulong)(uint)unaff_R15->data_capacity_;
          do {
            if ((int)uVar10 < 1) {
              iVar9 = -0x80000000;
              goto LAB_00103bb5;
            }
            uVar8 = (int)uVar10 - 1;
            uVar10 = (ulong)uVar8;
          } while ((unaff_R15->bitmap_[uVar8 >> 6] >> (uVar10 & 0x3f) & 1) == 0);
          iVar9 = unaff_R15->key_slots_[uVar8];
LAB_00103bb5:
          if (iVar9 < iVar4) {
            unaff_R15 = pAVar5;
          }
        }
        else {
          unaff_R15 = pAVar5->next_leaf_;
          if (unaff_R15 ==
              (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
               *)0x0) break;
          iVar9 = 0x7fffffff;
          if (0 < unaff_R15->data_capacity_) {
            uVar10 = 0;
            do {
              if ((unaff_R15->bitmap_[uVar10 >> 6 & 0x3ffffff] >> (uVar10 & 0x3f) & 1) != 0) {
                iVar9 = unaff_R15->key_slots_[uVar10];
                break;
              }
              uVar10 = uVar10 + 1;
            } while (unaff_R15->data_capacity_ != (int)uVar10);
          }
          if (iVar4 < iVar9) {
            unaff_R15 = pAVar5;
          }
        }
      }
      this_00 = unaff_R15;
    } while (bVar3 == false);
  }
  iVar4 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
          erase(this_00,key);
  (this->stats_).num_keys = (this->stats_).num_keys - iVar4;
  if (this_00->num_keys_ == 0) {
    merge(this,this_00,*key);
  }
  lVar6 = 0xac;
  if (((this->istats_).key_domain_max_ < *key) ||
     (lVar6 = 0xb0, *key < (this->istats_).key_domain_min_)) {
    piVar1 = (int *)((long)&this->root_node_ + lVar6);
    *piVar1 = *piVar1 - iVar4;
  }
  return iVar4;
}

Assistant:

int erase(const T& key) {
    data_node_type* leaf = get_leaf(key);
    int num_erased = leaf->erase(key);
    stats_.num_keys -= num_erased;
    if (leaf->num_keys_ == 0) {
      merge(leaf, key);
    }
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain -= num_erased;
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain -= num_erased;
    }
    return num_erased;
  }